

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayout::saveState(QDockAreaLayout *this,QDataStream *stream)

{
  long lVar1;
  long lVar2;
  QDataStream *pQVar3;
  int iVar4;
  int i;
  QRect *this_00;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator<<(stream);
  iVar4 = 0;
  for (lVar2 = 0; lVar2 != 0x1c0; lVar2 = lVar2 + 0x70) {
    iVar4 = (iVar4 + 1) - (uint)(*(long *)((long)&this->docks[0].item_list.d.size + lVar2) == 0);
  }
  QDataStream::operator<<(stream,iVar4);
  this_00 = &this->docks[0].rect;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    lVar1._0_4_ = this_00[2].x2;
    lVar1._4_4_ = this_00[2].y2;
    if (lVar1 != 0) {
      pQVar3 = (QDataStream *)QDataStream::operator<<(stream,(int)lVar2);
      local_40 = QRect::size(this_00);
      ::operator<<(pQVar3,&local_40);
      QDockAreaLayoutInfo::saveState((QDockAreaLayoutInfo *)&this_00[-3].x2,stream);
    }
    this_00 = this_00 + 7;
  }
  local_40 = QRect::size(&this->centralWidgetRect);
  ::operator<<(stream,&local_40);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    QDataStream::operator<<(stream,this->corners[lVar2]);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::saveState(QDataStream &stream) const
{
    stream << (uchar) DockWidgetStateMarker;
    int cnt = 0;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        if (!docks[i].item_list.isEmpty())
            ++cnt;
    }
    stream << cnt;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        if (docks[i].item_list.isEmpty())
            continue;
        stream << i << docks[i].rect.size();
        docks[i].saveState(stream);
    }

    stream << centralWidgetRect.size();

    for (int i = 0; i < 4; ++i)
        stream << static_cast<int>(corners[i]);
}